

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetIndexBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pIndexBuffer,
          Uint64 ByteOffset,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  String *__return_storage_ptr__;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  BIND_FLAGS BVar3;
  BufferVkImpl *pBVar4;
  Char *pCVar5;
  RenderPassVkImpl *pRVar6;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  char *local_138;
  char *local_108;
  undefined1 local_100 [8];
  string msg_4;
  BufferDesc *BuffDesc;
  string msg_3;
  undefined1 local_98 [8];
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  RESOURCE_STATE_TRANSITION_MODE StateTransitionMode_local;
  Uint64 ByteOffset_local;
  IBuffer *pIndexBuffer_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._M_local_buf[0xf] = StateTransitionMode;
  pBVar4 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pIndexBuffer);
  RefCntAutoPtr<Diligent::BufferVkImpl>::operator=(&this->m_pIndexBuffer,pBVar4);
  this->m_IndexDataStartOffset = ByteOffset;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_48,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"SetIndexBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x344);
      std::__cxx11::string::~string((string *)local_48);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"SetIndexBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x344);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar2 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    in_R8 = " queue.";
    FormatString<char[15],char[22],std::__cxx11::string,char[8]>
              ((string *)local_98,(Diligent *)"SetIndexBuffer",(char (*) [15])0xf4cb59,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"SetIndexBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x344);
    std::__cxx11::string::~string((string *)local_98);
  }
  pRVar6 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if ((pRVar6 != (RenderPassVkImpl *)0x0) && (msg.field_2._M_local_buf[0xf] == '\x01')) {
    FormatString<char[188]>
              ((string *)&BuffDesc,
               (char (*) [188])
               "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first."
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"SetIndexBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x348);
    std::__cxx11::string::~string((string *)&BuffDesc);
  }
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&this->m_pIndexBuffer);
  if (bVar1) {
    pBVar4 = RefCntAutoPtr<Diligent::BufferVkImpl>::operator->(&this->m_pIndexBuffer);
    msg_4.field_2._8_8_ =
         DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
         GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  *)pBVar4);
    BVar3 = Diligent::operator&(((BufferDesc *)msg_4.field_2._8_8_)->BindFlags,BIND_INDEX_BUFFER);
    if (BVar3 == BIND_NONE) {
      if (*(long *)msg_4.field_2._8_8_ == 0) {
        local_138 = "";
      }
      else {
        local_138 = *(char **)msg_4.field_2._8_8_;
      }
      local_108 = local_138;
      FormatString<char[9],char_const*,char[74]>
                ((string *)local_100,(Diligent *)0xe50594,(char (*) [9])&local_108,
                 (char **)
                 "\' being bound as index buffer was not created with BIND_INDEX_BUFFER flag",
                 (char (*) [74])in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"SetIndexBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x34e);
      std::__cxx11::string::~string((string *)local_100);
    }
  }
  (this->m_Stats).CommandCounters.SetIndexBuffer =
       (this->m_Stats).CommandCounters.SetIndexBuffer + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetIndexBuffer(
    IBuffer*                       pIndexBuffer,
    Uint64                         ByteOffset,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    m_pIndexBuffer         = ClassPtrCast<BufferImplType>(pIndexBuffer);
    m_IndexDataStartOffset = ByteOffset;

#ifdef DILIGENT_DEVELOPMENT
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetIndexBuffer");

    DEV_CHECK_ERR(!(m_pActiveRenderPass != nullptr && StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION),
                  "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. "
                  "Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first.");

    if (m_pIndexBuffer)
    {
        const BufferDesc& BuffDesc = m_pIndexBuffer->GetDesc();
        DEV_CHECK_ERR((BuffDesc.BindFlags & BIND_INDEX_BUFFER) != 0,
                      "Buffer '", BuffDesc.Name ? BuffDesc.Name : "", "' being bound as index buffer was not created with BIND_INDEX_BUFFER flag");
    }
#endif

    ++m_Stats.CommandCounters.SetIndexBuffer;
}